

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutputTest.cpp
# Opt level: O3

void __thiscall
TEST_TestOutput_PrintInVisualStudioFormat_TestShell::
~TEST_TestOutput_PrintInVisualStudioFormat_TestShell
          (TEST_TestOutput_PrintInVisualStudioFormat_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(TestOutput, PrintInVisualStudioFormat)
{
    TestOutput::setWorkingEnvironment(TestOutput::visualStudio);
    printer->printFailure(*f3);
    const char* expected =
            "\nfile(10): error: Failure in TEST(group, test)"
            "\nfile(2): error:\n\tmessage\n\n";
    STRCMP_EQUAL(expected, mock->getOutput().asCharString());
}